

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadMemory(BinaryReader *this,Limits *out_page_limits)

{
  bool bVar1;
  bool bVar2;
  Result RVar3;
  bool is_shared;
  bool has_max;
  uint32_t local_2c;
  uint local_28;
  uint32_t max;
  uint32_t initial;
  uint32_t flags;
  Limits *out_page_limits_local;
  BinaryReader *this_local;
  
  local_2c = 0;
  _initial = out_page_limits;
  out_page_limits_local = (Limits *)this;
  RVar3 = ReadU32Leb128(this,&max,"memory flags");
  bVar1 = Failed(RVar3);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar3 = ReadU32Leb128(this,&local_28,"memory initial page count");
    bVar1 = Failed(RVar3);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      bVar1 = (max & 1) != 0;
      if (bVar1) {
        RVar3 = ReadU32Leb128(this,&local_2c,"memory max page count");
        bVar2 = Failed(RVar3);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
      }
      _initial->has_max = bVar1;
      _initial->is_shared = (max & 2) != 0;
      _initial->initial = (ulong)local_28;
      _initial->max = (ulong)local_2c;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits) {
  uint32_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU32Leb128(&flags, "memory flags"));
  CHECK_RESULT(ReadU32Leb128(&initial, "memory initial page count"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "memory max page count"));
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->initial = initial;
  out_page_limits->max = max;
  return Result::Ok;
}